

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_copy(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  uint uVar2;
  uint local_30;
  uint32 stream_len;
  uint32 spos;
  int32 j;
  int32 i;
  int32 win;
  mfcc_t **feat_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  iVar1 = fcb->window_size;
  for (spos = -iVar1; (int)spos <= iVar1; spos = spos + 1) {
    local_30 = 0;
    for (stream_len = 0; (int)stream_len < fcb->n_stream; stream_len = stream_len + 1) {
      uVar2 = fcb->stream_len[(int)stream_len] / (iVar1 * 2 + 1U);
      memcpy(feat[(int)stream_len] + (spos + iVar1) * uVar2,mfc[(int)spos] + local_30,
             (ulong)uVar2 << 2);
      local_30 = uVar2 + local_30;
    }
  }
  return;
}

Assistant:

static void
feat_copy(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    int32 win, i, j;

    win = feat_window_size(fcb);

    /* Concatenate input features */
    for (i = -win; i <= win; ++i) {
        uint32 spos = 0;

        for (j = 0; j < feat_n_stream(fcb); ++j) {
            uint32 stream_len;

            /* Unscale the stream length by the window. */
            stream_len = feat_stream_len(fcb, j) / (2 * win + 1);
            memcpy(feat[j] + ((i + win) * stream_len),
                   mfc[i] + spos,
                   stream_len * sizeof(mfcc_t));
            spos += stream_len;
        }
    }
}